

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiWindowSettings * __thiscall
ImChunkStream<ImGuiWindowSettings>::alloc_chunk(ImChunkStream<ImGuiWindowSettings> *this,size_t sz)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *__dest;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  iVar2 = (this->Buf).Size;
  uVar7 = (int)sz + 7U & 0xfffffffc;
  iVar5 = iVar2 + uVar7;
  iVar3 = (this->Buf).Capacity;
  if (iVar3 < iVar5) {
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    if (iVar6 <= iVar5) {
      iVar6 = iVar5;
    }
    if (iVar3 < iVar6) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
      pcVar4 = (this->Buf).Data;
      if (pcVar4 != (char *)0x0) {
        memcpy(__dest,pcVar4,(long)(this->Buf).Size);
        pcVar4 = (this->Buf).Data;
        if ((pcVar4 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar4,GImAllocatorUserData);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar6;
    }
  }
  (this->Buf).Size = iVar5;
  *(uint *)((this->Buf).Data + iVar2) = uVar7;
  return (ImGuiWindowSettings *)((this->Buf).Data + (long)iVar2 + 4);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = IM_MEMALIGN(HDR_SZ + sz, 4u); int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }